

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicNetwork.hpp
# Opt level: O0

void __thiscall
BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager>::~BasicNetwork
          (BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> *this)

{
  IEventManager *pIVar1;
  bool bVar2;
  map<unsigned_long,_INeuron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
  *this_00;
  reference ppVar3;
  pair<const_unsigned_long,_INeuron_*> id_ptr;
  iterator __end0;
  iterator __begin0;
  map<unsigned_long,_INeuron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
  *__range1;
  BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> *this_local;
  
  (this->super_INetwork)._vptr_INetwork = (_func_int **)&PTR__BasicNetwork_00143c98;
  this_00 = &(this->super_INetwork).neuronMap;
  __end0 = std::
           map<unsigned_long,_INeuron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
           ::begin(this_00);
  id_ptr.second =
       (INeuron *)
       std::
       map<unsigned_long,_INeuron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
       ::end(this_00);
  while( true ) {
    bVar2 = std::operator!=(&__end0,(_Self *)&id_ptr.second);
    if (!bVar2) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_INeuron_*>_>::operator*(&__end0);
    id_ptr.first = (unsigned_long)ppVar3->second;
    if ((INeuron *)id_ptr.first != (INeuron *)0x0) {
      (*((INeuron *)id_ptr.first)->_vptr_INeuron[3])();
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_INeuron_*>_>::operator++(&__end0);
  }
  pIVar1 = (this->super_INetwork).eventManager;
  if (pIVar1 != (IEventManager *)0x0) {
    (**(code **)(*(long *)pIVar1 + 8))();
  }
  INetwork::~INetwork(&this->super_INetwork);
  return;
}

Assistant:

BasicNetwork<Neuron, Synapse, EventManager>::~BasicNetwork()
{
    for ( auto id_ptr: neuronMap ) {
        delete id_ptr.second;
    }
    delete eventManager;
}